

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::ContentEncoding::~ContentEncoding(ContentEncoding *this)

{
  ContentCompression **ppCVar1;
  ContentCompression *this_00;
  ContentEncryption **ppCVar2;
  ContentEncryption *this_01;
  ContentCompression **ppCVar3;
  ContentEncryption **ppCVar4;
  ContentEncryption *enc;
  ContentEncryption **enc_j;
  ContentEncryption **enc_i;
  ContentCompression *comp;
  ContentCompression **comp_j;
  ContentCompression **comp_i;
  ContentEncoding *this_local;
  
  ppCVar1 = this->compression_entries_end_;
  comp_j = this->compression_entries_;
  while (comp_j != ppCVar1) {
    ppCVar3 = comp_j + 1;
    this_00 = *comp_j;
    comp_j = ppCVar3;
    if (this_00 != (ContentCompression *)0x0) {
      ContentCompression::~ContentCompression(this_00);
      operator_delete(this_00);
    }
  }
  if (this->compression_entries_ != (ContentCompression **)0x0) {
    operator_delete__(this->compression_entries_);
  }
  ppCVar2 = this->encryption_entries_end_;
  enc_j = this->encryption_entries_;
  while (enc_j != ppCVar2) {
    ppCVar4 = enc_j + 1;
    this_01 = *enc_j;
    enc_j = ppCVar4;
    if (this_01 != (ContentEncryption *)0x0) {
      ContentEncryption::~ContentEncryption(this_01);
      operator_delete(this_01);
    }
  }
  if (this->encryption_entries_ != (ContentEncryption **)0x0) {
    operator_delete__(this->encryption_entries_);
  }
  return;
}

Assistant:

ContentEncoding::~ContentEncoding() {
  ContentCompression** comp_i = compression_entries_;
  ContentCompression** const comp_j = compression_entries_end_;

  while (comp_i != comp_j) {
    ContentCompression* const comp = *comp_i++;
    delete comp;
  }

  delete[] compression_entries_;

  ContentEncryption** enc_i = encryption_entries_;
  ContentEncryption** const enc_j = encryption_entries_end_;

  while (enc_i != enc_j) {
    ContentEncryption* const enc = *enc_i++;
    delete enc;
  }

  delete[] encryption_entries_;
}